

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O1

void __thiscall
Population::Population(Population *this,int amount,string *modelName,Parameters *param)

{
  vector<Neuron_*,_std::allocator<Neuron_*>_> *this_00;
  int iVar1;
  iaf_psc_alpha *piVar2;
  iaf_psc_alpha *local_40;
  Population *local_38;
  
  this->_vptr_Population = (_func_int **)&PTR_update_001238a0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->neurons;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->numberOfNeurons = amount;
  this->numberOfOutputNeurons = amount;
  this->numberOfInputNeurons = amount;
  local_38 = this;
  initialize(this);
  iVar1 = std::__cxx11::string::compare((char *)modelName);
  if (iVar1 == 0) {
    if (0 < amount) {
      do {
        piVar2 = (iaf_psc_alpha *)operator_new(0x50);
        LIF::LIF((LIF *)piVar2,(LIF_param *)param);
        local_40 = piVar2;
        std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                  ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
        amount = amount + -1;
      } while (amount != 0);
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)modelName);
    if (iVar1 == 0) {
      if (0 < amount) {
        iVar1 = 0;
        do {
          piVar2 = (iaf_psc_alpha *)operator_new(0x60);
          Izhikevich::Izhikevich
                    ((Izhikevich *)piVar2,(long)local_38,iVar1,(Izhikevich_param *)param);
          local_40 = piVar2;
          std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                    ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
          iVar1 = iVar1 + 1;
        } while (amount != iVar1);
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)modelName);
      if (iVar1 == 0) {
        if (0 < amount) {
          do {
            piVar2 = (iaf_psc_alpha *)operator_new(0x60);
            CurrentGenerator::CurrentGenerator
                      ((CurrentGenerator *)piVar2,(CurrentGenerator_param *)param);
            local_40 = piVar2;
            std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                      ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
            amount = amount + -1;
          } while (amount != 0);
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)modelName);
        if (iVar1 == 0) {
          if (0 < amount) {
            do {
              piVar2 = (iaf_psc_alpha *)operator_new(0x60);
              SignalGenerator::SignalGenerator
                        ((SignalGenerator *)piVar2,(SignalGenerator_param *)param);
              local_40 = piVar2;
              std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                        ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
              amount = amount + -1;
            } while (amount != 0);
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)modelName);
          if (iVar1 == 0) {
            if (0 < amount) {
              do {
                piVar2 = (iaf_psc_alpha *)operator_new(0x48);
                PassThrough::PassThrough((PassThrough *)piVar2,(PassThrough_param *)param);
                local_40 = piVar2;
                std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                          ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
                amount = amount + -1;
              } while (amount != 0);
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)modelName);
            if (0 < amount && iVar1 == 0) {
              iVar1 = 0;
              do {
                piVar2 = (iaf_psc_alpha *)operator_new(0x118);
                iaf_psc_alpha::iaf_psc_alpha
                          (piVar2,(long)local_38,iVar1,(iaf_psc_alpha_param *)param);
                local_40 = piVar2;
                std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                          ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
                iVar1 = iVar1 + 1;
              } while (amount != iVar1);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Population(int amount, std::string modelName, Parameters* param) {
        numberOfNeurons = amount;
        numberOfOutputNeurons = numberOfOutputNeurons == 0? amount : numberOfOutputNeurons;
        numberOfInputNeurons = numberOfInputNeurons == 0? amount : numberOfInputNeurons;
        initialize();
        if(modelName == "iaf") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new LIF(static_cast<LIF_param*>(param)));
            }
        }
        else if(modelName == "izhikevich") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new Izhikevich((long)this, i, static_cast<Izhikevich_param*>(param)));
            }
        }
        else if(modelName == "CurrentGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new CurrentGenerator(static_cast<CurrentGenerator_param*>(param)));
            }
        }
        else if(modelName == "SignalGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new SignalGenerator(static_cast<SignalGenerator_param*>(param)));
            }
        }
        else if(modelName == "PassThrough") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new PassThrough(static_cast<PassThrough_param*>(param)));
            }
        }
        else if(modelName == "iaf_psc_alpha") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new iaf_psc_alpha((long)this, i, static_cast<iaf_psc_alpha_param*>(param)));
            }
        }
        else {
            // TODOS throw exception
        }
    }